

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

bool QObjectPrivate::removeConnection(Connection *c)

{
  __pointer_type pQVar1;
  __pointer_type pQVar2;
  ConnectionData *this;
  QObject *pQVar3;
  bool bVar4;
  int __sig;
  QBasicMutex *pQVar5;
  uint uVar6;
  QBasicMutex *this_00;
  uint uVar7;
  uint uVar8;
  QBasicMutex *this_01;
  long in_FS_OFFSET;
  QOrderedMutexLocker local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((c != (Connection *)0x0) &&
     (pQVar2 = (c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p,
     pQVar2 != (__pointer_type)0x0)) {
    uVar6 = *(uint *)&c->sender % 0x418;
    uVar7 = uVar6 >> 3;
    this_00 = (QBasicMutex *)
              ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + (ulong)(uVar6 & 0x7f8));
    uVar8 = (int)pQVar2 + (int)(((ulong)pQVar2 & 0xffffffff) / 0x418) * -0x418;
    uVar6 = uVar8 >> 3;
    this_01 = (QBasicMutex *)
              ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + (ulong)(uVar8 & 0x7f8));
    local_50.mtx1 = this_00;
    if (this_01 < this_00) {
      local_50.mtx1 = this_01;
    }
    pQVar5 = this_00;
    if (this_00 < this_01) {
      pQVar5 = this_01;
    }
    local_50.mtx2 = (QBasicMutex *)0x0;
    if (uVar7 != uVar6) {
      local_50.mtx2 = pQVar5;
    }
    local_50._16_8_ = 0xaaaaaaaaaaaaaa00;
    QOrderedMutexLocker::relock(&local_50);
    if ((c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p != (__pointer_type)0x0)
    {
      this = (ConnectionData *)(c->sender->d_ptr).d[1].parent;
      ConnectionData::removeConnection(this,c);
      pQVar3 = c->sender;
      __sig = (**pQVar3->_vptr_QObject)(pQVar3);
      QMetaObjectPrivate::signal
                (__sig,(__sighandler_t)(ulong)(uint)((*(int *)&c->field_0x54 << 5) >> 5));
      (*pQVar3->_vptr_QObject[0xb])(pQVar3);
      if (uVar7 != uVar6) {
        LOCK();
        pQVar1 = (this_01->d_ptr)._q_value._M_b._M_p;
        (this_01->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        if (pQVar1 != (__pointer_type)0x1) {
          QBasicMutex::unlockInternalFutex(this_01,pQVar1);
        }
      }
      if (((this->orphaned)._M_i.c != 0) &&
         ((this->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 1)) {
        ConnectionData::cleanOrphanedConnectionsImpl
                  (this,c->sender,AlreadyLockedAndTemporarilyReleasingLock);
      }
      LOCK();
      pQVar1 = (this_00->d_ptr)._q_value._M_b._M_p;
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (pQVar1 != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(this_00,pQVar1);
      }
      local_50._16_8_ = local_50._16_8_ & 0xffffffffffffff00;
      QOrderedMutexLocker::unlock(&local_50);
      bVar4 = true;
      goto LAB_002ba3d3;
    }
    QOrderedMutexLocker::unlock(&local_50);
  }
  bVar4 = false;
LAB_002ba3d3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

inline bool QObjectPrivate::removeConnection(QObjectPrivate::Connection *c)
{
    if (!c)
        return false;
    QObject *receiver = c->receiver.loadRelaxed();
    if (!receiver)
        return false;

    QBasicMutex *senderMutex = signalSlotLock(c->sender);
    QBasicMutex *receiverMutex = signalSlotLock(receiver);

    QObjectPrivate::ConnectionData *connections;
    {
        QOrderedMutexLocker locker(senderMutex, receiverMutex);

        // load receiver once again and recheck to ensure nobody else has removed the connection in the meantime
        receiver = c->receiver.loadRelaxed();
        if (!receiver)
            return false;

        connections = QObjectPrivate::get(c->sender)->connections.loadRelaxed();
        Q_ASSERT(connections);
        connections->removeConnection(c);

        c->sender->disconnectNotify(QMetaObjectPrivate::signal(c->sender->metaObject(), c->signal_index));
        // We must not hold the receiver mutex, else we risk dead-locking; we also only need the sender mutex
        // It is however vital to hold the senderMutex before calling cleanOrphanedConnections, as otherwise
        // another thread might modify/delete the connection
        if (receiverMutex != senderMutex) {
            receiverMutex->unlock();
        }
        connections->cleanOrphanedConnections(c->sender, ConnectionData::AlreadyLockedAndTemporarilyReleasingLock);
        senderMutex->unlock(); // now both sender and receiver mutex have been manually unlocked
        locker.dismiss(); // so we dismiss the QOrderedMutexLocker
    }

    return true;
}